

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinVWN_RPA>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  ulong uVar1;
  ulong uVar2;
  double e;
  double local_30;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    lda_screening_interface<ExchCXX::BuiltinVWN_RPA>::eval_exc_polar
              (*(double *)((long)rho + uVar1 * 2),*(double *)((long)rho + uVar1 * 2 + 8),&local_30);
    *(double *)((long)eps + uVar1) = local_30 * scal_fact + *(double *)((long)eps + uVar1);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}